

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O3

void wasm::Thread::mainLoop(void *self_)

{
  long lVar1;
  long *plVar2;
  code *pcVar3;
  int iVar4;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  
  lVar1 = (long)self_ + 0x70;
  plVar2 = (long *)((long)self_ + 0x80);
  do {
    lock._M_device._0_1_ = 0;
    local_40 = (undefined1  [8])((long)self_ + 0x10);
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    lock._M_device._0_1_ = 1;
    if (*plVar2 == 0) {
      if (*(char *)((long)self_ + 0x68) != '\0') {
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
        return;
      }
    }
    else {
      while( true ) {
        iVar4 = (**(code **)((long)self_ + 0x88))(lVar1);
        pcVar3 = (code *)*plVar2;
        if (iVar4 != 0) break;
        if (pcVar3 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
      }
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(lVar1,lVar1,3);
        *plVar2 = 0;
        *(undefined8 *)((long)self_ + 0x88) = 0;
      }
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    ThreadPool::notifyThreadIsReady(*self_);
    lock._M_device._0_1_ = 0;
    local_40 = (undefined1  [8])((long)self_ + 0x10);
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    lock._M_device._0_1_ = 1;
    if ((*(char *)((long)self_ + 0x68) == '\0') && (*plVar2 == 0)) {
      std::condition_variable::wait((unique_lock *)((long)self_ + 0x38));
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  } while( true );
}

Assistant:

void Thread::mainLoop(void* self_) {
  auto* self = static_cast<Thread*>(self_);
  while (1) {
    DEBUG_THREAD("checking for work\n");
    {
      std::unique_lock<std::mutex> lock(self->mutex);
      if (self->doWork) {
        DEBUG_THREAD("doing work\n");
        // run tasks until they are all done
        while (self->doWork() == ThreadWorkState::More) {
        }
        self->doWork = nullptr;
      } else if (self->done) {
        DEBUG_THREAD("done\n");
        return;
      }
    }
    self->parent->notifyThreadIsReady();
    {
      std::unique_lock<std::mutex> lock(self->mutex);
      if (!self->done && !self->doWork) {
        DEBUG_THREAD("thread waiting\n");
        self->condition.wait(lock);
      }
    }
  }
}